

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep_parser.cc
# Opt level: O2

bool __thiscall DyndepParser::ParseEdge(DyndepParser *this,string *err)

{
  Lexer *this_00;
  BindingEnv *env;
  pointer *pppVar1;
  StringPiece path_00;
  StringPiece path_01;
  StringPiece path_02;
  bool bVar2;
  byte bVar3;
  bool bVar4;
  Node *pNVar5;
  pointer pEVar6;
  size_type *this_01;
  pair<std::_Rb_tree_iterator<std::pair<Edge_*const,_Dyndeps>_>,_bool> pVar7;
  _Base_ptr *local_150;
  string path;
  EvalString out;
  vector<EvalString,_std::allocator<EvalString>_> ins;
  Node *n;
  string rule_name;
  vector<EvalString,_std::allocator<EvalString>_> outs;
  uint64_t slash_bits;
  pointer ppStack_50;
  pointer local_48;
  _Base_ptr *local_38;
  
  ins.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  ins.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  ins.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this_00 = &(this->super_Parser).lexer_;
  bVar2 = Lexer::ReadPath(this_00,(EvalString *)&ins,err);
  if (bVar2) {
    if (ins.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
        super__Vector_impl_data._M_start ==
        ins.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&rule_name,"expected path",(allocator<char> *)&out);
      bVar2 = Lexer::Error(this_00,&rule_name,err);
      this_01 = (size_type *)(ulong)bVar2;
      std::__cxx11::string::~string((string *)&rule_name);
      bVar2 = false;
      local_150 = (_Base_ptr *)0x0;
    }
    else {
      EvalString::Evaluate_abi_cxx11_(&path,(EvalString *)&ins,(Env *)&this->env_);
      outs.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)&outs.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
      outs.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      outs.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)((ulong)outs.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl
                            .super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
      bVar2 = CanonicalizePath(&path,&slash_bits,(string *)&outs);
      if (bVar2) {
        path_00.len_ = path._M_string_length;
        path_00.str_ = path._M_dataplus._M_p;
        pNVar5 = State::LookupNode((this->super_Parser).state_,path_00);
        if ((pNVar5 == (Node *)0x0) || (pNVar5->in_edge_ == (Edge *)0x0)) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out,
                         "no build statement exists for \'",&path);
          std::operator+(&rule_name,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out,
                         "\'");
          bVar2 = Lexer::Error(this_00,&rule_name,err);
LAB_0010feb4:
          std::__cxx11::string::~string((string *)&rule_name);
          std::__cxx11::string::~string((string *)&out);
          goto LAB_0010fece;
        }
        out.parsed_.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
        ._M_impl.super__Vector_impl_data._M_start._0_2_ = 0;
        this_01 = &rule_name._M_string_length;
        rule_name._M_string_length = rule_name._M_string_length & 0xffffffffffff0000;
        rule_name.field_2._M_allocated_capacity = 0;
        rule_name.field_2._8_8_ = 0;
        out.parsed_.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        out.parsed_.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        rule_name._M_dataplus._M_p = (pointer)pNVar5->in_edge_;
        pVar7 = std::
                _Rb_tree<Edge*,std::pair<Edge*const,Dyndeps>,std::_Select1st<std::pair<Edge*const,Dyndeps>>,std::less<Edge*>,std::allocator<std::pair<Edge*const,Dyndeps>>>
                ::_M_insert_unique<std::pair<Edge*const,Dyndeps>>
                          ((_Rb_tree<Edge*,std::pair<Edge*const,Dyndeps>,std::_Select1st<std::pair<Edge*const,Dyndeps>>,std::less<Edge*>,std::allocator<std::pair<Edge*const,Dyndeps>>>
                            *)this->dyndep_file_,(pair<Edge_*const,_Dyndeps> *)&rule_name);
        Dyndeps::~Dyndeps((Dyndeps *)this_01);
        Dyndeps::~Dyndeps((Dyndeps *)&out);
        if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out,
                         "multiple statements for \'",&path);
          std::operator+(&rule_name,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out,
                         "\'");
          bVar2 = Lexer::Error(this_00,&rule_name,err);
          goto LAB_0010feb4;
        }
        local_150 = &pVar7.first._M_node._M_node[1]._M_parent;
        bVar2 = true;
      }
      else {
        bVar2 = Lexer::Error(this_00,(string *)&outs,err);
LAB_0010fece:
        this_01 = (size_type *)(ulong)bVar2;
        bVar2 = false;
        local_150 = (_Base_ptr *)0x0;
      }
      std::__cxx11::string::~string((string *)&outs);
      std::__cxx11::string::~string((string *)&path);
    }
  }
  else {
    bVar2 = false;
    local_150 = (_Base_ptr *)0x0;
    this_01 = (size_type *)0x0;
  }
  bVar3 = (byte)this_01;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
             *)&ins);
  if (!bVar2) goto LAB_001100de;
  out.parsed_.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_2_ = 0;
  out.parsed_.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ._M_impl.super__Vector_impl_data._M_start._2_6_ = 0;
  out.parsed_.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  out.parsed_.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar2 = Lexer::ReadPath(this_00,&out,err);
  if (bVar2) {
    if ((pointer)CONCAT62(out.parsed_.
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                          ._M_impl.super__Vector_impl_data._M_start._2_6_,
                          out.parsed_.
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                          ._M_impl.super__Vector_impl_data._M_start._0_2_) ==
        out.parsed_.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      bVar2 = true;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&rule_name,"explicit outputs not supported",(allocator<char> *)&path);
      bVar2 = Lexer::Error(this_00,&rule_name,err);
      this_01 = (size_type *)(ulong)bVar2;
      std::__cxx11::string::~string((string *)&rule_name);
      bVar2 = false;
    }
  }
  else {
    bVar2 = false;
    this_01 = (size_type *)0x0;
  }
  bVar3 = (byte)this_01;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ::~vector(&out.parsed_);
  if (!bVar2) goto LAB_001100de;
  outs.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  outs.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  outs.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  bVar2 = Lexer::PeekToken(this_00,PIPE);
  if (bVar2) {
    while( true ) {
      rule_name._M_dataplus._M_p = (pointer)0x0;
      rule_name._M_string_length = 0;
      rule_name.field_2._M_allocated_capacity = 0;
      bVar2 = Lexer::ReadPath(this_00,(EvalString *)&rule_name,err);
      if (!bVar2) break;
      if (rule_name._M_dataplus._M_p == (pointer)rule_name._M_string_length) {
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                   *)&rule_name);
        goto LAB_00110036;
      }
      std::vector<EvalString,_std::allocator<EvalString>_>::push_back
                (&outs,(value_type *)&rule_name);
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                 *)&rule_name);
    }
    bVar3 = err != (string *)0x0;
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
               *)&rule_name);
  }
  else {
LAB_00110036:
    bVar2 = Parser::ExpectToken(&this->super_Parser,COLON,err);
    if (bVar2) {
      rule_name._M_dataplus._M_p = (pointer)&rule_name.field_2;
      rule_name._M_string_length = 0;
      rule_name.field_2._M_allocated_capacity =
           rule_name.field_2._M_allocated_capacity & 0xffffffffffffff00;
      bVar2 = Lexer::ReadIdent(this_00,&rule_name);
      if ((!bVar2) || (bVar2 = std::operator!=(&rule_name,"dyndep"), bVar2)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&out,"expected build command name \'dyndep\'",(allocator<char> *)&path)
        ;
        bVar3 = Lexer::Error(this_00,(string *)&out,err);
        std::__cxx11::string::~string((string *)&out);
      }
      else {
        path._M_dataplus._M_p = (pointer)0x0;
        path._M_string_length = 0;
        path.field_2._M_allocated_capacity = 0;
        bVar2 = Lexer::ReadPath(this_00,(EvalString *)&path,err);
        if (bVar2) {
          if (path._M_dataplus._M_p == (pointer)path._M_string_length) {
            bVar2 = true;
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&out,"explicit inputs not supported",(allocator<char> *)&ins);
            bVar2 = Lexer::Error(this_00,(string *)&out,err);
            this_01 = (size_type *)(ulong)bVar2;
            std::__cxx11::string::~string((string *)&out);
            bVar2 = false;
          }
        }
        else {
          bVar2 = false;
          this_01 = (size_type *)0x0;
        }
        bVar3 = (byte)this_01;
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                   *)&path);
        if (bVar2) {
          ins.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          ins.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          ins.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          bVar2 = Lexer::PeekToken(this_00,PIPE);
          if (bVar2) {
            while( true ) {
              out.parsed_.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
              ._M_impl.super__Vector_impl_data._M_start._0_2_ = 0;
              out.parsed_.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
              ._M_impl.super__Vector_impl_data._M_start._2_6_ = 0;
              out.parsed_.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              out.parsed_.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              bVar2 = Lexer::ReadPath(this_00,&out,err);
              if (!bVar2) break;
              if ((pointer)CONCAT62(out.parsed_.
                                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start._2_6_,
                                    out.parsed_.
                                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start._0_2_) ==
                  out.parsed_.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                std::
                vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                ::~vector(&out.parsed_);
                goto LAB_00110201;
              }
              std::vector<EvalString,_std::allocator<EvalString>_>::push_back(&ins,&out);
              std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
              ::~vector(&out.parsed_);
            }
            bVar3 = err != (string *)0x0;
            std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
            ::~vector(&out.parsed_);
          }
          else {
LAB_00110201:
            bVar2 = Lexer::PeekToken(this_00,PIPE2);
            if (bVar2) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&out,"order-only inputs not supported",(allocator<char> *)&path);
              bVar3 = Lexer::Error(this_00,(string *)&out,err);
              std::__cxx11::string::~string((string *)&out);
            }
            else {
              bVar2 = Parser::ExpectToken(&this->super_Parser,NEWLINE,err);
              if (bVar2) {
                bVar2 = Lexer::PeekToken(this_00,INDENT);
                if (bVar2) {
                  pppVar1 = &out.parsed_.
                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  out.parsed_.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                  ._M_impl.super__Vector_impl_data._M_start._0_2_ = SUB82(pppVar1,0);
                  out.parsed_.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                  ._M_impl.super__Vector_impl_data._M_start._2_6_ =
                       (undefined6)((ulong)pppVar1 >> 0x10);
                  out.parsed_.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  out.parsed_.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage =
                       (pointer)((ulong)out.parsed_.
                                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage &
                                0xffffffffffffff00);
                  slash_bits = 0;
                  ppStack_50 = (pointer)0x0;
                  local_48 = (pointer)0x0;
                  bVar2 = ParseLet(this,(string *)&out,(EvalString *)&slash_bits,err);
                  if (bVar2) {
                    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&out,"restat");
                    if (bVar2) {
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&path,"binding is not \'restat\'",(allocator<char> *)&n);
                      bVar2 = Lexer::Error(this_00,&path,err);
                      this_01 = (size_type *)(ulong)bVar2;
                      std::__cxx11::string::~string((string *)&path);
                      bVar2 = false;
                    }
                    else {
                      EvalString::Evaluate_abi_cxx11_
                                (&path,(EvalString *)&slash_bits,(Env *)&this->env_);
                      *(bool *)((long)local_150 + 1) = path._M_string_length != 0;
                      std::__cxx11::string::~string((string *)&path);
                      bVar2 = true;
                    }
                  }
                  else {
                    bVar2 = false;
                    this_01 = (size_type *)0x0;
                  }
                  bVar3 = (byte)this_01;
                  std::
                  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                             *)&slash_bits);
                  std::__cxx11::string::~string((string *)&out);
                  if (!bVar2) goto LAB_00110568;
                }
                local_38 = local_150 + 1;
                std::vector<Node_*,_std::allocator<Node_*>_>::reserve
                          ((vector<Node_*,_std::allocator<Node_*>_> *)local_38,
                           ((long)ins.super__Vector_base<EvalString,_std::allocator<EvalString>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)ins.super__Vector_base<EvalString,_std::allocator<EvalString>_>.
                                 _M_impl.super__Vector_impl_data._M_start) / 0x18);
                env = &this->env_;
                pEVar6 = ins.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
                         super__Vector_impl_data._M_start;
                do {
                  if (pEVar6 == ins.super__Vector_base<EvalString,_std::allocator<EvalString>_>.
                                _M_impl.super__Vector_impl_data._M_finish) {
                    std::vector<Node_*,_std::allocator<Node_*>_>::reserve
                              ((vector<Node_*,_std::allocator<Node_*>_> *)(local_150 + 4),
                               ((long)outs.
                                      super__Vector_base<EvalString,_std::allocator<EvalString>_>.
                                      _M_impl.super__Vector_impl_data._M_finish -
                               (long)outs.
                                     super__Vector_base<EvalString,_std::allocator<EvalString>_>.
                                     _M_impl.super__Vector_impl_data._M_start) / 0x18);
                    pEVar6 = outs.super__Vector_base<EvalString,_std::allocator<EvalString>_>.
                             _M_impl.super__Vector_impl_data._M_start;
                    goto LAB_00110499;
                  }
                  EvalString::Evaluate_abi_cxx11_((string *)&out,pEVar6,(Env *)env);
                  path._M_dataplus._M_p = (pointer)&path.field_2;
                  path._M_string_length = 0;
                  path.field_2._M_allocated_capacity =
                       path.field_2._M_allocated_capacity & 0xffffffffffffff00;
                  bVar2 = CanonicalizePath((string *)&out,&slash_bits,&path);
                  if (bVar2) {
                    path_01.str_._2_6_ =
                         out.parsed_.
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._2_6_;
                    path_01.str_._0_2_ =
                         out.parsed_.
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._0_2_;
                    path_01.len_ = (size_t)out.parsed_.
                                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish;
                    n = State::GetNode((this->super_Parser).state_,path_01,env,slash_bits);
                    std::vector<Node_*,_std::allocator<Node_*>_>::push_back
                              ((vector<Node_*,_std::allocator<Node_*>_> *)local_38,&n);
                  }
                  else {
                    bVar4 = Lexer::Error(this_00,&path,err);
                    this_01 = (size_type *)(ulong)bVar4;
                  }
                  bVar3 = (byte)this_01;
                  std::__cxx11::string::~string((string *)&path);
                  std::__cxx11::string::~string((string *)&out);
                  pEVar6 = pEVar6 + 1;
                } while (bVar2);
              }
              else {
                bVar3 = 0;
              }
            }
          }
LAB_00110568:
          std::vector<EvalString,_std::allocator<EvalString>_>::~vector(&ins);
        }
      }
      std::__cxx11::string::~string((string *)&rule_name);
    }
    else {
      bVar3 = 0;
    }
  }
  std::vector<EvalString,_std::allocator<EvalString>_>::~vector(&outs);
LAB_001100de:
  return (bool)(bVar3 & 1);
  while( true ) {
    EvalString::Evaluate_abi_cxx11_((string *)&out,pEVar6,(Env *)env);
    path._M_dataplus._M_p = (pointer)&path.field_2;
    path._M_string_length = 0;
    path.field_2._M_allocated_capacity = path.field_2._M_allocated_capacity & 0xffffffffffffff00;
    bVar2 = CanonicalizePath((string *)&out,&slash_bits,&path);
    if (bVar2) {
      path_02.str_._2_6_ =
           out.parsed_.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
           ._M_impl.super__Vector_impl_data._M_start._2_6_;
      path_02.str_._0_2_ =
           out.parsed_.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
           ._M_impl.super__Vector_impl_data._M_start._0_2_;
      path_02.len_ = (size_t)out.parsed_.
                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
      n = State::GetNode((this->super_Parser).state_,path_02,env,slash_bits);
      std::vector<Node_*,_std::allocator<Node_*>_>::push_back
                ((vector<Node_*,_std::allocator<Node_*>_> *)(local_150 + 4),&n);
    }
    else {
      bVar4 = Lexer::Error(this_00,&path,err);
      this_01 = (size_type *)(ulong)bVar4;
    }
    bVar3 = (byte)this_01;
    std::__cxx11::string::~string((string *)&path);
    std::__cxx11::string::~string((string *)&out);
    pEVar6 = pEVar6 + 1;
    if (!bVar2) break;
LAB_00110499:
    if (pEVar6 == outs.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      bVar3 = 1;
      break;
    }
  }
  goto LAB_00110568;
}

Assistant:

bool DyndepParser::ParseEdge(string* err) {
  // Parse one explicit output.  We expect it to already have an edge.
  // We will record its dynamically-discovered dependency information.
  Dyndeps* dyndeps = NULL;
  {
    EvalString out0;
    if (!lexer_.ReadPath(&out0, err))
      return false;
    if (out0.empty())
      return lexer_.Error("expected path", err);

    string path = out0.Evaluate(&env_);
    string path_err;
    uint64_t slash_bits;
    if (!CanonicalizePath(&path, &slash_bits, &path_err))
      return lexer_.Error(path_err, err);
    Node* node = state_->LookupNode(path);
    if (!node || !node->in_edge())
      return lexer_.Error("no build statement exists for '" + path + "'", err);
    Edge* edge = node->in_edge();
    std::pair<DyndepFile::iterator, bool> res =
      dyndep_file_->insert(DyndepFile::value_type(edge, Dyndeps()));
    if (!res.second)
      return lexer_.Error("multiple statements for '" + path + "'", err);
    dyndeps = &res.first->second;
  }

  // Disallow explicit outputs.
  {
    EvalString out;
    if (!lexer_.ReadPath(&out, err))
      return false;
    if (!out.empty())
      return lexer_.Error("explicit outputs not supported", err);
  }

  // Parse implicit outputs, if any.
  vector<EvalString> outs;
  if (lexer_.PeekToken(Lexer::PIPE)) {
    for (;;) {
      EvalString out;
      if (!lexer_.ReadPath(&out, err))
        return err;
      if (out.empty())
        break;
      outs.push_back(out);
    }
  }

  if (!ExpectToken(Lexer::COLON, err))
    return false;

  string rule_name;
  if (!lexer_.ReadIdent(&rule_name) || rule_name != "dyndep")
    return lexer_.Error("expected build command name 'dyndep'", err);

  // Disallow explicit inputs.
  {
    EvalString in;
    if (!lexer_.ReadPath(&in, err))
      return false;
    if (!in.empty())
      return lexer_.Error("explicit inputs not supported", err);
  }

  // Parse implicit inputs, if any.
  vector<EvalString> ins;
  if (lexer_.PeekToken(Lexer::PIPE)) {
    for (;;) {
      EvalString in;
      if (!lexer_.ReadPath(&in, err))
        return err;
      if (in.empty())
        break;
      ins.push_back(in);
    }
  }

  // Disallow order-only inputs.
  if (lexer_.PeekToken(Lexer::PIPE2))
    return lexer_.Error("order-only inputs not supported", err);

  if (!ExpectToken(Lexer::NEWLINE, err))
    return false;

  if (lexer_.PeekToken(Lexer::INDENT)) {
    string key;
    EvalString val;
    if (!ParseLet(&key, &val, err))
      return false;
    if (key != "restat")
      return lexer_.Error("binding is not 'restat'", err);
    string value = val.Evaluate(&env_);
    dyndeps->restat_ = !value.empty();
  }

  dyndeps->implicit_inputs_.reserve(ins.size());
  for (vector<EvalString>::iterator i = ins.begin(); i != ins.end(); ++i) {
    string path = i->Evaluate(&env_);
    string path_err;
    uint64_t slash_bits;
    if (!CanonicalizePath(&path, &slash_bits, &path_err))
      return lexer_.Error(path_err, err);
    Node* n = state_->GetNode(path, &env_, slash_bits);
    dyndeps->implicit_inputs_.push_back(n);
  }

  dyndeps->implicit_outputs_.reserve(outs.size());
  for (vector<EvalString>::iterator i = outs.begin(); i != outs.end(); ++i) {
    string path = i->Evaluate(&env_);
    string path_err;
    uint64_t slash_bits;
    if (!CanonicalizePath(&path, &slash_bits, &path_err))
      return lexer_.Error(path_err, err);
    Node* n = state_->GetNode(path, &env_, slash_bits);
    dyndeps->implicit_outputs_.push_back(n);
  }

  return true;
}